

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::tydra::(anonymous_namespace)::ConvertTexTransform2d_abi_cxx11_
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Stage *stage,Path *tx_abs_path,
          UsdTransform2d *tx,UVTexture *tex_out,double timecode)

{
  ulong *puVar1;
  undefined8 *puVar2;
  size_type *psVar3;
  long *plVar4;
  size_type sVar5;
  vtable_type *pvVar6;
  size_type sVar7;
  Prim *prim;
  bool bVar8;
  undefined1 uVar9;
  int iVar10;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_00;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_01;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_02;
  Shader *pSVar11;
  UsdPrimvarReader<std::array<float,_2UL>_> *pUVar12;
  Token *pTVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  StringData *pSVar15;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_03;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *peVar16;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_04;
  long *plVar17;
  Path *args;
  string *err_00;
  TerminalAttributeValue *value;
  _Alloc_hider _Var18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  char *pcVar20;
  optional<tinyusdz::Path::PathType> *poVar21;
  char *pcVar22;
  long lVar23;
  size_type *psVar24;
  _Alloc_hider _Var25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  float *pfVar27;
  UsdTransform2d *args_1;
  float fVar28;
  float rotation;
  matrix3f m;
  matrix3f m_1;
  Prim *pprim;
  float2 scale;
  string prop_part;
  float2 translation;
  string prim_part;
  string err;
  string varname;
  matrix3f ret_1;
  TerminalAttributeValue attr;
  matrix3f ret;
  string local_3f8;
  undefined4 uStack_3d8;
  float local_3d4;
  matrix3f local_3d0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [32];
  Prim *local_378;
  array<float,_2UL> local_370;
  long *local_368 [2];
  long local_358 [2];
  double local_348;
  array<float,_2UL> local_340;
  string local_338;
  UsdTransform2d *local_318;
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [24];
  undefined1 local_2a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_290;
  Variability local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  bool local_260;
  storage_t<tinyusdz::Interpolation> local_25c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  bool local_248;
  undefined1 local_240 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_218;
  undefined1 local_208 [48];
  bool local_1d8;
  storage_t<double> local_1d0;
  bool local_1c8;
  storage_t<tinyusdz::Token> local_1c0;
  bool local_1a0;
  storage_t<tinyusdz::Token> local_198;
  bool local_178;
  storage_t<tinyusdz::Token> local_170;
  bool local_150;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_148;
  bool local_118;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  bool local_f0;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  bool local_c8;
  storage_t<tinyusdz::Token> local_c0;
  _Rb_tree_node_base local_98;
  size_t local_78;
  pointer pSStack_70;
  pointer local_68;
  pointer pSStack_60;
  value local_54 [36];
  
  psVar3 = &tx_abs_path[2]._variant_part_str._M_string_length;
  psVar24 = (size_type *)((long)&tx_abs_path[2]._element.field_2 + 8);
  if ((char)tx_abs_path[0xe]._variant_part_str._M_string_length != '\0') {
    psVar24 = psVar3;
  }
  args = tx_abs_path;
  args_1 = tx;
  local_348 = timecode;
  bVar8 = Animatable<float>::get((Animatable<float> *)(psVar24 + 0x139),timecode,&local_3d4,Linear);
  if (bVar8) {
    poVar21 = &tx_abs_path[2]._path_type;
    if (*(char *)&tx_abs_path[0x11]._element._M_dataplus._M_p != '\0') {
      poVar21 = (optional<tinyusdz::Path::PathType> *)psVar3;
    }
    local_318 = tx;
    bVar8 = Animatable<std::array<float,_2UL>_>::get
                      ((Animatable<std::array<float,_2UL>_> *)(poVar21 + 0x18a),local_348,&local_370
                       ,Linear);
    if (bVar8) {
      poVar21 = &tx_abs_path[2]._path_type;
      if (tx_abs_path[0x14]._valid != false) {
        poVar21 = (optional<tinyusdz::Path::PathType> *)psVar3;
      }
      bVar8 = Animatable<std::array<float,_2UL>_>::get
                        ((Animatable<std::array<float,_2UL>_> *)(poVar21 + 0x1dd),local_348,
                         &local_340,Linear);
      if (bVar8) {
        if (tx_abs_path[0xb]._variant_part_str.field_2._M_local_buf[8] == '\0') {
          if (((*(char *)&tx_abs_path[0xb]._variant_selection_part._M_dataplus._M_p == '\0') &&
              (tx_abs_path[0xb]._variant_part.field_2._M_allocated_capacity ==
               tx_abs_path[0xb]._variant_part._M_string_length)) &&
             (*(char *)&tx_abs_path[0xc]._prim_part._M_dataplus._M_p == '\0')) {
            local_2a8._0_8_ = "`inputs:in` must be authored.\n";
            goto LAB_00348143;
          }
        }
        else {
          plVar17 = (long *)tx_abs_path[0xb]._variant_part._M_string_length;
          plVar4 = (long *)tx_abs_path[0xb]._variant_part.field_2._M_allocated_capacity;
          if (plVar4 != plVar17) {
            if ((long)plVar4 - (long)plVar17 != 0xd0) {
              local_2a8._0_8_ = "`inputs:in` must be a single connection Path.\n";
              goto LAB_00348143;
            }
            local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_338,*plVar17,plVar17[1] + *plVar17);
            sVar5 = tx_abs_path[0xb]._variant_part._M_string_length;
            local_368[0] = local_358;
            lVar23 = *(long *)(sVar5 + 0x20);
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_368,lVar23,*(long *)(sVar5 + 0x28) + lVar23);
            iVar10 = ::std::__cxx11::string::compare((char *)local_368);
            if (iVar10 == 0) {
              local_310._0_8_ = local_300;
              local_310._8_8_ = 0;
              local_300[0] = false;
              local_378 = (Prim *)0x0;
              local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"");
              Path::Path((Path *)local_2a8,&local_338,(string *)&local_3f8);
              err_00 = (string *)local_310;
              bVar8 = Stage::find_prim_at_path((Stage *)this,(Path *)local_2a8,&local_378,err_00);
              Path::~Path((Path *)local_2a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                CONCAT44(local_3f8.field_2._M_allocated_capacity._4_4_,
                                         local_3f8.field_2._M_allocated_capacity._0_4_) + 1);
              }
              if (bVar8) {
                if (local_378 == (Prim *)0x0) {
                  pcVar22 = "[InternalError] Prim is nullptr: {}\n";
                  pcVar20 = "";
                  goto LAB_00348671;
                }
                pSVar11 = tinyusdz::value::Value::as<tinyusdz::Shader>(&local_378->_data,false);
                if (pSVar11 == (Shader *)0x0) {
                  local_3d0.m[0]._0_8_ = local_3d0.m[1] + 1;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_3d0,"{} must be Shader Prim, but got {}\n","");
                  fmt::format<std::__cxx11::string,std::__cxx11::string>
                            ((string *)&local_3f8,(fmt *)&local_3d0,&local_338,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_378->_prim_type_name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             args_1);
                  _Var18._M_p = local_3f8._M_dataplus._M_p;
                  goto LAB_00348694;
                }
                pUVar12 = tinyusdz::value::Value::
                          as<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                                    (&pSVar11->value,false);
                prim = local_378;
                if (pUVar12 == (UsdPrimvarReader<std::array<float,_2UL>_> *)0x0) {
                  pfVar27 = local_3d0.m[1] + 1;
                  local_3d0.m[0]._0_8_ = pfVar27;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_3d0,
                             "Shader {} must be UsdPrimvarReader_float2 type, but got {}(internal type {})\n"
                             ,"");
                  pvVar6 = (pSVar11->value).v_.vtable;
                  if (pvVar6 == (vtable_type *)0x0) {
                    local_3a8._0_8_ = local_398;
                    local_398._0_4_ = 0x64696f76;
                    local_3a8._8_8_ = 4;
                    local_398._4_4_ = local_398._4_4_ & 0xffffff00;
                  }
                  else {
                    (*pvVar6->type_name)((string *)local_3a8);
                  }
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            ((string *)&local_3f8,(fmt *)&local_3d0,&local_338,&pSVar11->info_id,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_3a8,&tex_out->prim_name);
                  local_2a8._0_8_ = local_2a8 + 0x10;
                  paVar19 = &local_3f8.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3f8._M_dataplus._M_p == paVar19) {
                    aStack_290._M_allocated_capacity =
                         CONCAT44(local_3f8.field_2._12_4_,local_3f8.field_2._8_4_);
                    local_3f8._M_dataplus._M_p = (pointer)local_2a8._0_8_;
                  }
                  local_2a8._20_4_ = local_3f8.field_2._M_allocated_capacity._4_4_;
                  local_2a8._16_4_ = local_3f8.field_2._M_allocated_capacity._0_4_;
                  sVar7 = CONCAT44(local_3f8._M_string_length._4_4_,
                                   (undefined4)local_3f8._M_string_length);
                  local_3f8._M_string_length._0_4_ = 0;
                  local_3f8._M_string_length._4_4_ = 0;
                  local_3f8.field_2._M_allocated_capacity._0_4_ =
                       local_3f8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
                  (__return_storage_ptr__->contained).
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value = false;
                  puVar1 = (ulong *)((long)&(__return_storage_ptr__->contained).
                                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            .field_0 + 0x10);
                  *(ulong **)
                   &(__return_storage_ptr__->contained).
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0 = puVar1;
                  if (local_3f8._M_dataplus._M_p == (pointer)local_2a8._0_8_) {
                    *puVar1 = local_2a8._16_8_;
                    *(size_type *)
                     ((long)&(__return_storage_ptr__->contained).
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .field_0 + 0x18) = aStack_290._M_allocated_capacity;
                  }
                  else {
                    (__return_storage_ptr__->contained).
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0.m_error._M_dataplus._M_p = local_3f8._M_dataplus._M_p;
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->contained).
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .field_0 + 0x10) = local_2a8._16_8_;
                  }
                  (__return_storage_ptr__->contained).
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_error._M_string_length = sVar7;
                  local_2a8._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_2a8._16_8_ = local_2a8._16_8_ & 0xffffffffffffff00;
                  local_3f8._M_dataplus._M_p = (pointer)paVar19;
                  if ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_3a8._0_8_ !=
                      (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_398) {
                    operator_delete((void *)local_3a8._0_8_,
                                    CONCAT44(local_398._4_4_,local_398._0_4_) + 1);
                  }
                  if ((float *)local_3d0.m[0]._0_8_ == pfVar27) goto LAB_0034874b;
                  goto LAB_0034873e;
                }
                local_300._16_8_ = &local_2e0;
                local_300._24_8_ = 0;
                local_2e0._M_local_buf[0] = false;
                local_2a8._8_8_ = &aStack_290;
                local_2a8[0] = 1;
                local_2a8._16_8_ = 0;
                aStack_290._M_allocated_capacity =
                     aStack_290._M_allocated_capacity & 0xffffffffffffff00;
                local_280 = Varying;
                local_268._M_p = (pointer)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
                local_278._M_allocated_capacity = 0;
                local_260 = false;
                local_25c = (storage_t<tinyusdz::Interpolation>)0x0;
                local_258._M_local_buf[0] = '\0';
                local_258._M_allocated_capacity._4_4_ = 0;
                local_258._8_2_ = 0;
                local_248 = false;
                local_1d0 = (storage_t<double>)0x0;
                local_1c8 = false;
                local_c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_c0._8_8_ = 0;
                local_c0._16_8_ = 0;
                local_c0._24_8_ = 0;
                local_98._M_left = &local_98;
                local_98._M_color = _S_red;
                local_98._M_parent = (_Base_ptr)0x0;
                aStack_218._M_local_buf[8] = '\0';
                local_240._32_8_ = 0;
                aStack_218._M_allocated_capacity = 0;
                local_240._16_8_ = 0;
                local_240._24_8_ = (pointer)0x0;
                local_240._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                local_240._8_8_ = 0;
                local_208._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                local_208._8_8_ = 0;
                local_208._16_8_ = 0;
                local_208._24_8_ = 0;
                local_208[0x20] = false;
                local_208._33_3_ = 0;
                local_208._36_4_ = (storage_t<tinyusdz::Path::PathType>)0x0;
                local_208._40_8_ = 0;
                local_1d8 = false;
                local_1c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_1c0._8_8_ = 0;
                local_1c0._16_8_ = 0;
                local_1c0._24_8_ = 0;
                local_1a0 = false;
                local_198.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_198._8_8_ = 0;
                local_198._16_8_ = 0;
                local_198._24_8_ = 0;
                local_178 = false;
                local_170.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_170._8_8_ = 0;
                local_170._16_8_ = 0;
                local_170._24_8_ = 0;
                local_150 = false;
                local_148.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_148._8_8_ = 0;
                local_148._16_8_ = 0;
                local_148._24_8_ = 0;
                local_148._32_8_ = 0;
                local_148._40_8_ = 0;
                local_118 = false;
                local_f0 = false;
                local_110._16_8_ = 0;
                local_110._24_8_ = 0;
                local_110.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_110._8_8_ = 0;
                local_c8 = false;
                local_e8._16_8_ = 0;
                local_e8._24_8_ = 0;
                local_e8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_e8._8_8_ = 0;
                local_78 = 0;
                pSStack_70 = (pointer)0x0;
                local_68 = (pointer)0x0;
                pSStack_60 = (pointer)0x0;
                local_98._M_right = local_98._M_left;
                local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_3f8,"inputs:varname","");
                value = (TerminalAttributeValue *)local_2a8;
                bVar8 = EvaluateAttribute((Stage *)this,prim,(string *)&local_3f8,value,
                                          (string *)local_310,NAN,Linear);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                  operator_delete(local_3f8._M_dataplus._M_p,
                                  CONCAT44(local_3f8.field_2._M_allocated_capacity._4_4_,
                                           local_3f8.field_2._M_allocated_capacity._0_4_) + 1);
                }
                if (bVar8) {
                  if ((bool)local_2a8[0] == false) {
                    pTVar13 = tinyusdz::value::Value::as<tinyusdz::Token>((Value *)&local_278,false)
                    ;
                    if (pTVar13 == (Token *)0x0) {
                      goto LAB_00348428;
                    }
LAB_0034845d:
                    ::std::__cxx11::string::_M_assign((string *)(local_300 + 0x10));
                    if (local_300._24_8_ == 0) {
                      local_3f8._M_dataplus._M_p._0_4_ = 8.660368e-39;
                      local_3f8._M_dataplus._M_p._4_4_ = 0;
                      nonstd::expected_lite::
                      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::expected<const_char_*,_0>
                                (__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_3f8)
                      ;
                    }
                    else {
                      local_3f8._M_dataplus._M_p._0_4_ = local_370._M_elems[0];
                      local_3f8._M_dataplus._M_p._4_4_ = 0;
                      local_3f8._M_string_length._0_4_ = 0;
                      local_3f8._M_string_length._4_4_ = 0;
                      local_3f8.field_2._M_allocated_capacity._0_4_ = local_370._M_elems[1];
                      local_3f8.field_2._M_allocated_capacity._4_4_ = 0;
                      local_3f8.field_2._8_4_ = 0;
                      local_3f8.field_2._12_4_ = 0;
                      uStack_3d8 = 0x3f800000;
                      local_3d0.m._8_8_ = local_3d0.m._8_8_ & 0xffffffff00000000;
                      local_3d0.m[1][2] = 0.0;
                      local_3d0.m[2][0] = 0.0;
                      local_3d0.m[2][1] = 0.0;
                      local_3d0.m[2][2] = 1.0;
                      fVar28 = cosf((local_3d4 * 3.141592) / 180.0);
                      local_3d0.m[0][0] = fVar28;
                      fVar28 = sinf((local_3d4 * 3.141592) / 180.0);
                      local_3d0.m[0][1] = fVar28;
                      fVar28 = sinf((local_3d4 * 3.141592) / 180.0);
                      local_3d0.m._8_8_ = CONCAT44(fVar28,local_3d0.m[0][2]) ^ 0x8000000000000000;
                      local_3d0.m[1][1] = cosf((local_3d4 * 3.141592) / 180.0);
                      local_3a8._0_8_ =
                           (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x3f800000;
                      local_3a8._8_8_ = 0;
                      local_398._8_4_ = local_340._M_elems[0];
                      local_398._12_4_ = local_340._M_elems[1];
                      local_398._0_4_ = 0x3f800000;
                      local_398._4_4_ = 0;
                      local_398._16_4_ = 0x3f800000;
                      tinyusdz::value::Mult<tinyusdz::value::matrix3f,float,3ul>
                                ((matrix3f *)local_54,(value *)&local_3f8,&local_3d0,
                                 (matrix3f *)value);
                      tinyusdz::value::Mult<tinyusdz::value::matrix3f,float,3ul>
                                ((matrix3f *)local_2d0,local_54,(matrix3f *)local_3a8,
                                 (matrix3f *)value);
                      *(undefined4 *)
                       &(local_318->super_ShaderNode).super_UsdShadePrim.meta.comment.field_0x4 =
                           local_2c0._16_4_;
                      ((_Alloc_hider *)
                      ((long)&(local_318->super_ShaderNode).super_UsdShadePrim.meta.doc.contained +
                      0x24))->_M_p = (pointer)local_2c0._0_8_;
                      *(undefined8 *)
                       ((long)&(local_318->super_ShaderNode).super_UsdShadePrim.meta.doc.contained +
                       0x2c) = local_2c0._8_8_;
                      *(undefined8 *)
                       ((long)&(local_318->super_ShaderNode).super_UsdShadePrim.meta.doc.contained +
                       0x14) = local_2d0._0_8_;
                      *(undefined8 *)
                       ((long)&(local_318->super_ShaderNode).super_UsdShadePrim.meta.doc.contained +
                       0x1c) = local_2d0._8_8_;
                      *(float *)&(local_318->super_ShaderNode).super_UsdShadePrim.meta.comment.
                                 contained = local_3d4;
                      *(_Type *)((long)&(local_318->super_ShaderNode).super_UsdShadePrim.meta.
                                        comment.contained + 0xc) = local_340._M_elems;
                      *(ulong *)((long)&(local_318->super_ShaderNode).super_UsdShadePrim.meta.
                                        comment.contained + 4) =
                           CONCAT44(local_370._M_elems[1],local_370._M_elems[0]);
                      *(undefined1 *)
                       ((long)&(local_318->super_ShaderNode).super_UsdShadePrim.meta.doc.contained +
                       0x10) = 1;
                      ::std::__cxx11::string::_M_assign
                                ((string *)
                                 ((long)&(local_318->super_ShaderNode).super_UsdShadePrim.meta.
                                         comment.contained + 0x18));
                      (__return_storage_ptr__->contained).
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value = true;
                      (__return_storage_ptr__->contained).
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .field_0.m_value = true;
                    }
                  }
                  else {
LAB_00348428:
                    uVar9 = local_2a8[0];
                    if ((local_2a8[0] & 1) == 0) {
                      pbVar14 = tinyusdz::value::Value::as<std::__cxx11::string>
                                          ((Value *)&local_278,false);
                      if (pbVar14 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      goto LAB_0034845d;
                      uVar9 = local_2a8[0];
                    }
                    if ((uVar9 & 1) == 0) {
                      pSVar15 = tinyusdz::value::Value::as<tinyusdz::value::StringData>
                                          ((Value *)&local_278,false);
                      if (pSVar15 != (StringData *)0x0) goto LAB_0034845d;
                    }
                    TerminalAttributeValue::type_name_abi_cxx11_
                              ((string *)local_2d0,(TerminalAttributeValue *)local_2a8);
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_3a8,
                                     "`inputs:varname` must be `token` or `string` type, but got ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_2d0);
                    plVar17 = (long *)::std::__cxx11::string::append((char *)local_3a8);
                    local_3d0.m[0]._0_8_ = local_3d0.m[1] + 1;
                    pfVar27 = (float *)(plVar17 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar17 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)pfVar27) {
                      local_3d0.m[1][1] = (float)*(long *)pfVar27;
                      local_3d0.m[1][2] = (float)((ulong)*(long *)pfVar27 >> 0x20);
                      local_3d0.m[2][0] = (float)plVar17[3];
                      local_3d0.m[2][1] = (float)((ulong)plVar17[3] >> 0x20);
                      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3d0.m[0]._0_8_;
                    }
                    else {
                      local_3d0.m[1][1] = (float)*(long *)pfVar27;
                      local_3d0.m[1][2] = (float)((ulong)*(long *)pfVar27 >> 0x20);
                      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*plVar17;
                    }
                    fVar28 = local_3d0.m[1][1];
                    sVar7 = plVar17[1];
                    *plVar17 = (long)pfVar27;
                    plVar17[1] = 0;
                    *(undefined1 *)(plVar17 + 2) = 0;
                    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
                    if (paVar19 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3d0.m[0]._0_8_) {
                      local_3f8.field_2._8_4_ = local_3d0.m[2][0];
                      local_3f8.field_2._12_4_ = local_3d0.m[2][1];
                      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3f8._M_dataplus._M_p;
                    }
                    local_3f8.field_2._M_allocated_capacity._4_4_ = local_3d0.m[1][2];
                    local_3d0.m[0][2] = 0.0;
                    local_3d0.m[1][0] = 0.0;
                    local_3d0.m[1][1] = (float)((uint)local_3d0.m[1][1] & 0xffffff00);
                    (__return_storage_ptr__->contained).
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value = false;
                    puVar2 = (undefined8 *)
                             ((long)&(__return_storage_ptr__->contained).
                                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     .field_0 + 0x10);
                    *(undefined8 **)
                     &(__return_storage_ptr__->contained).
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .field_0 = puVar2;
                    if (paVar19 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3f8._M_dataplus._M_p) {
                      *puVar2 = CONCAT44(local_3d0.m[1][2],fVar28);
                      *(ulong *)((long)&(__return_storage_ptr__->contained).
                                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        .field_0 + 0x18) =
                           CONCAT44(local_3f8.field_2._12_4_,local_3f8.field_2._8_4_);
                    }
                    else {
                      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        **)&(__return_storage_ptr__->contained).
                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .field_0 = paVar19;
                      *(ulong *)((long)&(__return_storage_ptr__->contained).
                                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        .field_0 + 0x10) = CONCAT44(local_3d0.m[1][2],fVar28);
                    }
                    (__return_storage_ptr__->contained).
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0.m_error._M_string_length = sVar7;
                    local_3f8._M_string_length._0_4_ = 0;
                    local_3f8._M_string_length._4_4_ = 0;
                    local_3f8.field_2._M_allocated_capacity._0_4_ = (uint)fVar28 & 0xffffff00;
                    if ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_3a8._0_8_ !=
                        (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_398) {
                      operator_delete((void *)local_3a8._0_8_,
                                      CONCAT44(local_398._4_4_,local_398._0_4_) + 1);
                    }
                    if ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2d0._0_8_ !=
                        (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2c0) goto LAB_00348b93;
                  }
                }
                else {
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_3a8,"`inputs:varname` evaluation failed: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_310);
                  plVar17 = (long *)::std::__cxx11::string::append((char *)local_3a8);
                  local_3d0.m[0]._0_8_ = local_3d0.m[1] + 1;
                  pfVar27 = (float *)(plVar17 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar17 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pfVar27) {
                    local_3d0.m[1][1] = (float)*(long *)pfVar27;
                    local_3d0.m[1][2] = (float)((ulong)*(long *)pfVar27 >> 0x20);
                    local_3d0.m[2][0] = (float)plVar17[3];
                    local_3d0.m[2][1] = (float)((ulong)plVar17[3] >> 0x20);
                    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3d0.m[0]._0_8_;
                  }
                  else {
                    local_3d0.m[1][1] = (float)*(long *)pfVar27;
                    local_3d0.m[1][2] = (float)((ulong)*(long *)pfVar27 >> 0x20);
                    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)*plVar17;
                  }
                  fVar28 = local_3d0.m[1][1];
                  sVar7 = plVar17[1];
                  *plVar17 = (long)pfVar27;
                  plVar17[1] = 0;
                  *(undefined1 *)(plVar17 + 2) = 0;
                  if (paVar19 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d0.m[0]._0_8_) {
                    paVar19 = &local_3f8.field_2;
                    local_3f8.field_2._8_4_ = local_3d0.m[2][0];
                    local_3f8.field_2._12_4_ = local_3d0.m[2][1];
                  }
                  local_3f8.field_2._M_allocated_capacity._4_4_ = local_3d0.m[1][2];
                  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
                  local_3d0.m[0][2] = 0.0;
                  local_3d0.m[1][0] = 0.0;
                  local_3d0.m[1][1] = (float)((uint)local_3d0.m[1][1] & 0xffffff00);
                  (__return_storage_ptr__->contained).
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value = false;
                  puVar2 = (undefined8 *)
                           ((long)&(__return_storage_ptr__->contained).
                                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   .field_0 + 0x10);
                  *(undefined8 **)
                   &(__return_storage_ptr__->contained).
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0 = puVar2;
                  if (paVar19 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3f8._M_dataplus._M_p) {
                    *puVar2 = CONCAT44(local_3d0.m[1][2],fVar28);
                    *(ulong *)((long)&(__return_storage_ptr__->contained).
                                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      .field_0 + 0x18) =
                         CONCAT44(local_3f8.field_2._12_4_,local_3f8.field_2._8_4_);
                  }
                  else {
                    (__return_storage_ptr__->contained).
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0.m_error._M_dataplus._M_p = (pointer)paVar19;
                    *(ulong *)((long)&(__return_storage_ptr__->contained).
                                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      .field_0 + 0x10) = CONCAT44(local_3d0.m[1][2],fVar28);
                  }
                  (__return_storage_ptr__->contained).
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_error._M_string_length = sVar7;
                  local_3f8._M_string_length._0_4_ = 0;
                  local_3f8._M_string_length._4_4_ = 0;
                  local_3f8.field_2._M_allocated_capacity._0_4_ = (uint)fVar28 & 0xffffff00;
                  if ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_3a8._0_8_ !=
                      (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_398) {
                    local_2c0._0_8_ = CONCAT44(local_398._4_4_,local_398._0_4_);
                    local_2d0._0_8_ = local_3a8._0_8_;
LAB_00348b93:
                    operator_delete((void *)local_2d0._0_8_,(ulong)(local_2c0._0_8_ + 1));
                  }
                }
                TerminalAttributeValue::~TerminalAttributeValue((TerminalAttributeValue *)local_2a8)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_300._16_8_ == &local_2e0) goto LAB_0034874b;
                lVar23 = CONCAT71(local_2e0._M_allocated_capacity._1_7_,local_2e0._M_local_buf[0]);
                paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_300._16_8_;
LAB_00348743:
                operator_delete(paVar26,lVar23 + 1);
              }
              else {
                pcVar22 = "`inputs:in` connection Path not found in the Stage. {}\n";
                pcVar20 = "";
LAB_00348671:
                local_3d0.m[0]._0_8_ = local_3d0.m[1] + 1;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_3d0,pcVar22,pcVar20);
                fmt::format<std::__cxx11::string>
                          (&local_3f8,(fmt *)&local_3d0,(string *)&local_338,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           err_00);
                _Var18._M_p = local_3f8._M_dataplus._M_p;
LAB_00348694:
                local_2a8._0_8_ = local_2a8 + 0x10;
                local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
                if (_Var18._M_p == local_3f8._M_dataplus._M_p) {
                  aStack_290._M_allocated_capacity =
                       CONCAT44(local_3f8.field_2._12_4_,local_3f8.field_2._8_4_);
                  _Var18._M_p = (pointer)local_2a8._0_8_;
                }
                local_2a8._20_4_ = local_3f8.field_2._M_allocated_capacity._4_4_;
                local_2a8._16_4_ = local_3f8.field_2._M_allocated_capacity._0_4_;
                sVar7 = CONCAT44(local_3f8._M_string_length._4_4_,
                                 (undefined4)local_3f8._M_string_length);
                local_3f8._M_string_length._0_4_ = 0;
                local_3f8._M_string_length._4_4_ = 0;
                local_3f8.field_2._M_allocated_capacity._0_4_ =
                     local_3f8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
                (__return_storage_ptr__->contained).
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value = false;
                puVar1 = (ulong *)((long)&(__return_storage_ptr__->contained).
                                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          .field_0 + 0x10);
                *(ulong **)
                 &(__return_storage_ptr__->contained).
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0 = puVar1;
                if (_Var18._M_p == (pointer)local_2a8._0_8_) {
                  *puVar1 = local_2a8._16_8_;
                  *(size_type *)
                   ((long)&(__return_storage_ptr__->contained).
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .field_0 + 0x18) = aStack_290._M_allocated_capacity;
                }
                else {
                  (__return_storage_ptr__->contained).
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_error._M_dataplus._M_p = _Var18._M_p;
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->contained).
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .field_0 + 0x10) = local_2a8._16_8_;
                }
                (__return_storage_ptr__->contained).
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0.m_error._M_string_length = sVar7;
                local_2a8._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_2a8._16_8_ = local_2a8._16_8_ & 0xffffffffffffff00;
                if ((float *)local_3d0.m[0]._0_8_ != local_3d0.m[1] + 1) {
LAB_0034873e:
                  lVar23 = CONCAT44(local_3d0.m[1][2],local_3d0.m[1][1]);
                  paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3d0.m[0]._0_8_;
                  goto LAB_00348743;
                }
              }
LAB_0034874b:
              peVar16 = (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_300;
              if ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_310._0_8_ != peVar16) {
                operator_delete((void *)local_310._0_8_,CONCAT71(local_300._1_7_,local_300[0]) + 1);
                peVar16 = extraout_RAX_03;
              }
            }
            else {
              local_2a8._0_8_ =
                   "`inputs:in` connection Path\'s property part must be `outputs:result`\n";
              nonstd::expected_lite::
              expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::expected<const_char_*,_0>
                        (__return_storage_ptr__,(unexpected_type<const_char_*> *)local_2a8);
              peVar16 = extraout_RAX;
            }
            if (local_368[0] != local_358) {
              operator_delete(local_368[0],local_358[0] + 1);
              peVar16 = extraout_RAX_04;
            }
            _Var25._M_p = local_338._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338._M_dataplus._M_p == &local_338.field_2) {
              return peVar16;
            }
            goto LAB_003480fa;
          }
        }
        local_2a8._0_8_ = "`inputs:in` must be a connection.\n";
LAB_00348143:
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<const_char_*,_0>
                  (__return_storage_ptr__,(unexpected_type<const_char_*> *)local_2a8);
        return extraout_RAX_02;
      }
      pcVar22 = "Failed to retrieve translation attribute from {}\n";
      pcVar20 = "";
    }
    else {
      pcVar22 = "Failed to retrieve scale attribute from {}\n";
      pcVar20 = "";
    }
  }
  else {
    pcVar22 = "Failed to retrieve rotation attribute from {}\n";
    pcVar20 = "";
  }
  pfVar27 = local_3d0.m[1] + 1;
  local_3d0.m[0]._0_8_ = pfVar27;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,pcVar22,pcVar20);
  Path::full_path_name_abi_cxx11_((string *)local_3a8,(Path *)stage);
  fmt::format<std::__cxx11::string>
            (&local_3f8,(fmt *)&local_3d0,(string *)local_3a8,&args->_prim_part);
  local_2a8._0_8_ = local_2a8 + 0x10;
  paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_3f8._M_dataplus._M_p._4_4_,local_3f8._M_dataplus._M_p._0_4_);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  if (paVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p) {
    aStack_290._M_allocated_capacity = CONCAT44(local_3f8.field_2._12_4_,local_3f8.field_2._8_4_);
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_;
  }
  local_2a8._20_4_ = local_3f8.field_2._M_allocated_capacity._4_4_;
  local_2a8._16_4_ = local_3f8.field_2._M_allocated_capacity._0_4_;
  sVar7 = CONCAT44(local_3f8._M_string_length._4_4_,(undefined4)local_3f8._M_string_length);
  local_3f8._M_string_length._0_4_ = 0;
  local_3f8._M_string_length._4_4_ = 0;
  local_3f8.field_2._M_allocated_capacity._0_4_ =
       local_3f8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = false;
  puVar1 = (ulong *)((long)&(__return_storage_ptr__->contained).
                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .field_0 + 0x10);
  *(ulong **)
   &(__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0 = puVar1;
  if (paVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._0_8_) {
    *puVar1 = local_2a8._16_8_;
    *(size_type *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0 + 0x18) = aStack_290._M_allocated_capacity;
  }
  else {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_dataplus._M_p = (pointer)paVar19;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0 + 0x10) = local_2a8._16_8_;
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_error._M_string_length = sVar7;
  local_2a8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_2a8._16_8_ = local_2a8._16_8_ & 0xffffffffffffff00;
  peVar16 = (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_398;
  if ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)local_3a8._0_8_ != peVar16) {
    operator_delete((void *)local_3a8._0_8_,CONCAT44(local_398._4_4_,local_398._0_4_) + 1);
    peVar16 = extraout_RAX_00;
  }
  if ((float *)local_3d0.m[0]._0_8_ == pfVar27) {
    return peVar16;
  }
  local_338.field_2._M_allocated_capacity = CONCAT44(local_3d0.m[1][2],local_3d0.m[1][1]);
  _Var25._M_p = (pointer)local_3d0.m[0]._0_8_;
LAB_003480fa:
  operator_delete(_Var25._M_p,local_338.field_2._M_allocated_capacity + 1);
  return extraout_RAX_01;
}

Assistant:

nonstd::expected<bool, std::string> ConvertTexTransform2d(
    const Stage &stage, const Path &tx_abs_path, const UsdTransform2d &tx,
    UVTexture *tex_out, double timecode) {
  float rotation;  // in angles
  if (!tx.rotation.get_value().get(timecode, &rotation)) {
    return nonstd::make_unexpected(
        fmt::format("Failed to retrieve rotation attribute from {}\n",
                    tx_abs_path.full_path_name()));
  }

  value::float2 scale;
  if (!tx.scale.get_value().get(timecode, &scale)) {
    return nonstd::make_unexpected(
        fmt::format("Failed to retrieve scale attribute from {}\n",
                    tx_abs_path.full_path_name()));
  }

  value::float2 translation;
  if (!tx.translation.get_value().get(timecode, &translation)) {
    return nonstd::make_unexpected(
        fmt::format("Failed to retrieve translation attribute from {}\n",
                    tx_abs_path.full_path_name()));
  }

  // must be authored and connected to PrimvarReader.
  if (!tx.in.authored()) {
    return nonstd::make_unexpected("`inputs:in` must be authored.\n");
  }

  if (!tx.in.is_connection()) {
    return nonstd::make_unexpected("`inputs:in` must be a connection.\n");
  }

  const auto &paths = tx.in.get_connections();
  if (paths.size() != 1) {
    return nonstd::make_unexpected(
        "`inputs:in` must be a single connection Path.\n");
  }

  std::string prim_part = paths[0].prim_part();
  std::string prop_part = paths[0].prop_part();

  if (prop_part != "outputs:result") {
    return nonstd::make_unexpected(
        "`inputs:in` connection Path's property part must be "
        "`outputs:result`\n");
  }

  std::string err;

  const Prim *pprim{nullptr};
  if (!stage.find_prim_at_path(Path(prim_part, ""), pprim, &err)) {
    return nonstd::make_unexpected(fmt::format(
        "`inputs:in` connection Path not found in the Stage. {}\n", prim_part));
  }

  if (!pprim) {
    return nonstd::make_unexpected(
        fmt::format("[InternalError] Prim is nullptr: {}\n", prim_part));
  }

  const Shader *pshader = pprim->as<Shader>();
  if (!pshader) {
    return nonstd::make_unexpected(
        fmt::format("{} must be Shader Prim, but got {}\n", prim_part,
                    pprim->prim_type_name()));
  }

  const UsdPrimvarReader_float2 *preader =
      pshader->value.as<UsdPrimvarReader_float2>();
  if (!preader) {
    return nonstd::make_unexpected(fmt::format(
        "Shader {} must be UsdPrimvarReader_float2 type, but got {}(internal type {})\n",
        prim_part, pshader->info_id, pshader->value.type_name()));
  }

  // Get value producing attribute(i.e, follow .connection and return
  // terminal Attribute value)
  //value::token varname;

  // 'string' for inputs:varname preferred.
  std::string varname;
#if 0
  if (!tydra::EvaluateShaderAttribute(stage, *pshader, "inputs:varname",
                                      &varname, &err)) {
    return nonstd::make_unexpected(
        fmt::format("Failed to evaluate UsdPrimvarReader_float2's "
                    "inputs:varname: {}\n",
                    err));
  }
#else
  TerminalAttributeValue attr;
  if (!tydra::EvaluateAttribute(stage, *pprim, "inputs:varname", &attr, &err)) {
    return nonstd::make_unexpected(
        "`inputs:varname` evaluation failed: " + err + "\n");
  }
  if (auto pvt = attr.as<value::token>()) {
    varname = pvt->str();
  } else if (auto pvs = attr.as<std::string>()) {
    varname = *pvs;
  } else if (auto pvsd = attr.as<value::StringData>()) {
    varname = (*pvsd).value;
  } else {
    return nonstd::make_unexpected(
        "`inputs:varname` must be `token` or `string` type, but got " + attr.type_name() +
        "\n");
  }
  if (varname.empty()) {
    return nonstd::make_unexpected("`inputs:varname` is empty token\n");
  }
  DCOUT("inputs:varname = " << varname);
#endif

  // Build transform matrix.
  // https://github.com/KhronosGroup/glTF/tree/main/extensions/2.0/Khronos/KHR_texture_transform
  // Since USD uses post-multiply,
  //
  // matrix = scale * rotate * translate
  //
  {
    mat3 s;
    s.set_scale(scale[0], scale[1], 1.0f);

    mat3 r = mat3::identity();

    r.m[0][0] = std::cos(math::radian(rotation));
    r.m[0][1] = std::sin(math::radian(rotation));

    r.m[1][0] = -std::sin(math::radian(rotation));
    r.m[1][1] = std::cos(math::radian(rotation));

    mat3 t = mat3::identity();
    t.set_translation(translation[0], translation[1], 1.0f);

    tex_out->transform = s * r * t;
  }

  tex_out->tx_rotation = rotation;
  tex_out->tx_translation = translation;
  tex_out->tx_scale = scale;
  tex_out->has_transform2d = true;

  tex_out->varname_uv = varname;

  return true;
}